

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal_cv_posix.cpp
# Opt level: O3

void pstore::descriptor_condition_variable::make_non_blocking(int fd)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  
  uVar1 = fcntl(fd,3);
  if (uVar1 != 0xffffffff) {
    iVar2 = fcntl(fd,4,(ulong)(uVar1 | 0x800));
    if (iVar2 != -1) {
      return;
    }
  }
  piVar3 = __errno_location();
  raise<pstore::errno_erc,char[6]>((errno_erc)*piVar3,(char (*) [6])"fcntl");
}

Assistant:

void descriptor_condition_variable::make_non_blocking (int const fd) {
        int flags = ::fcntl (fd, F_GETFL); // NOLINT
        if (flags == -1) {
            raise (errno_erc{errno}, "fcntl");
        }
        flags |= O_NONBLOCK;
        if (::fcntl (fd, F_SETFL, flags) == -1) { // NOLINT
            raise (errno_erc{errno}, "fcntl");
        }
    }